

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newLhs,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldLhs)

{
  bool bVar1;
  Representation RVar2;
  Status SVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  element_type *peVar5;
  ulong *puVar6;
  SPxInternalCodeException *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RCX;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objChange;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  currRhs;
  Status *stat;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff478;
  int in_stack_fffffffffffff47c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff480;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff488;
  allocator *paVar7;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  type_conflict5 tVar8;
  undefined1 local_b30 [24];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4e8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff4f0;
  double in_stack_fffffffffffff510;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff524;
  allocator local_ac9;
  string local_ac8 [32];
  undefined8 local_aa8;
  undefined1 local_aa0 [68];
  int in_stack_fffffffffffff5a4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5a8;
  undefined1 local_a50 [80];
  undefined1 local_a00 [80];
  ulong local_9b0;
  undefined1 local_9a8 [80];
  undefined1 local_958 [80];
  undefined1 local_908 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b8;
  undefined1 local_868 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_818;
  undefined1 local_7c8 [80];
  undefined1 local_778 [80];
  undefined1 local_728 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_688;
  undefined1 local_638 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5e8;
  undefined1 local_598 [80];
  undefined1 local_548 [80];
  ulong local_4f8;
  undefined1 local_4f0 [80];
  undefined8 local_4a0;
  undefined1 local_498 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  Status *local_3f8;
  int local_3dc [3];
  undefined8 local_3d0;
  undefined8 *local_3c8;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  ulong *local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined1 *local_390;
  undefined8 local_388;
  ulong *local_380;
  undefined1 *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  undefined1 *local_348;
  undefined1 *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  undefined1 *local_328;
  undefined1 *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  ulong *local_290;
  undefined8 local_288;
  ulong *local_280;
  undefined8 *local_278;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_269;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_229;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined1 *local_1f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1a9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc(&in_RDI->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        );
  local_3f8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Desc::rowStatus((Desc *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
  local_370 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs(in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
  local_368 = &local_448;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
  local_4a0 = 0;
  local_3c0 = local_498;
  local_3c8 = &local_4a0;
  local_3d0 = 0;
  local_278 = local_3c8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (double)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
  SPxOut::
  debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[41],_int_&,_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
            (in_RDI,(char (*) [41])"DCHANG03 changeLhsStatus()  : row {}: {}",local_3dc,local_3f8);
  switch(*local_3f8) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    RVar2 = rep(in_RDI);
    tVar8 = false;
    if (RVar2 == ROW) {
      local_aa8 = 0;
      tVar8 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                         (double *)0x4cde2f);
    }
    if (tVar8 != false) {
      forceRecompNonbasicValue(in_stack_fffffffffffff488);
    }
    SVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualRowStatus(in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a4);
    *local_3f8 = SVar3;
    break;
  case P_FIXED:
    local_318 = local_a50;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    local_308 = local_aa0;
    local_310 = &local_448;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    tolerances(in_RDI);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4cdd50);
    Tolerances::epsilon(peVar5);
    bVar1 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                       in_stack_fffffffffffff518,in_stack_fffffffffffff510);
    if (bVar1) {
      *local_3f8 = P_ON_UPPER;
      bVar1 = isInitialized(in_RDI);
      if (bVar1) {
        pnVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::maxRowObj(in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
        local_298 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
        local_2a0 = pnVar4;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
      }
    }
    break;
  default:
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    paVar7 = &local_ac9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ac8,"XCHANG03 This should never happen.",paVar7);
    SPxInternalCodeException::SPxInternalCodeException
              (this_00,(string *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                SPxInternalCodeException::~SPxInternalCodeException);
  case P_ON_LOWER:
    puVar6 = (ulong *)infinity();
    local_4f8 = *puVar6 ^ 0x8000000000000000;
    local_3a8 = local_4f0;
    local_3b0 = &local_4f8;
    local_3b8 = 0;
    local_280 = local_3b0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (double)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
    tVar8 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4cd0fa);
    if (tVar8) {
      local_398 = infinity();
      local_390 = local_548;
      local_3a0 = 0;
      local_288 = local_398;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                 (double)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      tVar8 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4cd16e);
      if (tVar8) {
        *local_3f8 = P_FREE;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar2 = rep(in_RDI), RVar2 == COLUMN))
        {
          local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
          local_20 = &local_5e8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = &local_5e8;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
          local_8 = &local_5e8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_118 = local_598;
          local_120 = &local_5e8;
          local_128 = in_RCX;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_129,local_120,in_RCX);
          local_110 = local_598;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_f8 = local_598;
          local_100 = local_120;
          local_108 = local_128;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (cpp_dec_float<100U,_int,_void> *)0x4cd2f5);
          local_2a8 = local_498;
          local_2b0 = local_598;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
        }
      }
      else {
        *local_3f8 = P_ON_UPPER;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar2 = rep(in_RDI), RVar2 == COLUMN))
        {
          local_160 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
          local_158 = &local_688;
          local_168 = &local_448;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_169,local_160,local_168);
          local_150 = &local_688;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_138 = &local_688;
          local_140 = local_160;
          local_148 = local_168;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (cpp_dec_float<100U,_int,_void> *)0x4cd429);
          local_1a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
          local_198 = &local_6d8;
          local_1a8 = in_RCX;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1a9,local_1a0,in_RCX);
          local_190 = &local_6d8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_178 = &local_6d8;
          local_180 = local_1a0;
          local_188 = local_1a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (cpp_dec_float<100U,_int,_void> *)0x4cd4f0);
          local_58 = local_638;
          local_60 = &local_688;
          local_68 = &local_6d8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,local_60,local_68);
          local_50 = local_638;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_38 = local_638;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (cpp_dec_float<100U,_int,_void> *)0x4cd5a7);
          local_2b8 = local_498;
          local_2c0 = local_638;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
        }
      }
    }
    else {
      local_358 = local_728;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
      local_348 = local_778;
      local_350 = &local_448;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
      tolerances(in_RDI);
      peVar5 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4cd65c);
      Tolerances::epsilon(peVar5);
      bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                         in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      if (bVar1) {
        *local_3f8 = P_FIXED;
        if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) && (RVar2 = rep(in_RDI), RVar2 == COLUMN))
        {
          pnVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::maxRowObj(in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
          local_98 = &local_818;
          local_a8 = in_RCX;
          local_a0 = in_RDX;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,in_RDX,in_RCX);
          local_90 = &local_818;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_78 = &local_818;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (cpp_dec_float<100U,_int,_void> *)0x4cd77f);
          local_1d8 = local_7c8;
          local_1e8 = &local_818;
          local_1e0 = pnVar4;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1e9,pnVar4,local_1e8);
          local_1d0 = local_7c8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
          local_1b8 = local_7c8;
          local_1c0 = local_1e0;
          local_1c8 = local_1e8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                     (cpp_dec_float<100U,_int,_void> *)0x4cd833);
          local_2c8 = local_498;
          local_2d0 = local_7c8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
        }
      }
      else if (((in_RDI->m_nonbasicValueUpToDate & 1U) != 0) &&
              (RVar2 = rep(in_RDI), RVar2 == COLUMN)) {
        pnVar4 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
        local_d8 = &local_8b8;
        local_e8 = in_RCX;
        local_e0 = in_RDX;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_e9,in_RDX,in_RCX);
        local_d0 = &local_8b8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
        local_b8 = &local_8b8;
        local_c0 = local_e0;
        local_c8 = local_e8;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                   (cpp_dec_float<100U,_int,_void> *)0x4cd963);
        local_218 = local_868;
        local_228 = &local_8b8;
        local_220 = pnVar4;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_229,pnVar4,local_228);
        local_210 = local_868;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
        local_1f8 = local_868;
        local_200 = local_220;
        local_208 = local_228;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                   (cpp_dec_float<100U,_int,_void> *)0x4cda17);
        local_2d8 = local_498;
        local_2e0 = local_868;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
      }
    }
    break;
  case P_ON_UPPER:
    local_338 = local_908;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    local_328 = local_958;
    local_330 = &local_448;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    tolerances(in_RDI);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4cdace);
    Tolerances::epsilon(peVar5);
    bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                       in_stack_fffffffffffff518,in_stack_fffffffffffff510);
    if (bVar1) {
      *local_3f8 = P_FIXED;
    }
    break;
  case P_FREE:
    puVar6 = (ulong *)infinity();
    local_9b0 = *puVar6 ^ 0x8000000000000000;
    local_378 = local_9a8;
    local_380 = &local_9b0;
    local_388 = 0;
    local_290 = local_380;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (double)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
    tVar8 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4cdb98);
    if (((tVar8) && (*local_3f8 = P_ON_LOWER, (in_RDI->m_nonbasicValueUpToDate & 1U) != 0)) &&
       (RVar2 = rep(in_RDI), RVar2 == COLUMN)) {
      local_260 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffff480,in_stack_fffffffffffff47c);
      local_258 = local_a00;
      local_268 = in_RDX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_269,local_260,in_RDX);
      local_250 = local_a00;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480);
      local_238 = local_a00;
      local_240 = local_260;
      local_248 = local_268;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),
                 (cpp_dec_float<100U,_int,_void> *)0x4cdc9b);
      local_2e8 = local_498;
      local_2f0 = local_a00;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    }
  }
  SPxOut::
  debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[8],_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status_&,_0>
            (in_RDI,(char (*) [8])0x7e8819,local_3f8);
  RVar2 = rep(in_RDI);
  if (RVar2 == COLUMN) {
    local_2f8 = local_b30;
    local_300 = local_498;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff480,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    updateNonbasicValue(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhsStatus(int i, R newLhs, R oldLhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currRhs   = this->rhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG03 changeLhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newLhs <= R(-infinity))
      {
         if(currRhs >= R(infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theURbound[i] * oldLhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theLRbound[i] * currRhs) - (theURbound[i] * oldLhs);
         }
      }
      else if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newLhs - oldLhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theURbound[i] * (newLhs - oldLhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newLhs > R(-infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theURbound[i] * newLhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(isInitialized())
            theLRbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG03 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}